

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O1

size_t bpkiCSRDec(bpki_csr_info_t *ci,octet *csr,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  octet *poVar3;
  size_t sVar4;
  octet *poVar5;
  der_anchor_t AlgId [1];
  der_anchor_t SPKI [1];
  der_anchor_t CertReqInfo [1];
  der_anchor_t CertReq [1];
  der_anchor_t dStack_b8;
  der_anchor_t local_98;
  der_anchor_t local_78;
  der_anchor_t local_58;
  
  sVar1 = derTSEQDecStart(&local_58,csr,count,0x30);
  poVar3 = (octet *)0xffffffffffffffff;
  if (sVar1 != 0xffffffffffffffff) {
    poVar5 = csr + sVar1;
    ci->body_offset = sVar1;
    sVar2 = derTSEQDecStart(&local_78,poVar5,count - sVar1,0x30);
    if (sVar2 != 0xffffffffffffffff) {
      sVar4 = (count - sVar1) - sVar2;
      poVar5 = poVar5 + sVar2;
      sVar1 = derTSIZEDec2(poVar5,sVar4,2,0);
      if (sVar1 != 0xffffffffffffffff) {
        sVar4 = sVar4 - sVar1;
        poVar5 = poVar5 + sVar1;
        sVar1 = derDec2((octet **)0x0,(size_t *)0x0,poVar5,sVar4,0x30);
        if (sVar1 != 0xffffffffffffffff) {
          sVar4 = sVar4 - sVar1;
          poVar5 = poVar5 + sVar1;
          sVar1 = derTSEQDecStart(&local_98,poVar5,sVar4,0x30);
          if (sVar1 != 0xffffffffffffffff) {
            sVar4 = sVar4 - sVar1;
            poVar5 = poVar5 + sVar1;
            sVar1 = derTSEQDecStart(&dStack_b8,poVar5,sVar4,0x30);
            if (sVar1 != 0xffffffffffffffff) {
              sVar4 = sVar4 - sVar1;
              poVar5 = poVar5 + sVar1;
              sVar1 = derOIDDec2(poVar5,sVar4,"1.2.112.0.2.0.34.101.45.2.1");
              if (sVar1 != 0xffffffffffffffff) {
                sVar4 = sVar4 - sVar1;
                poVar5 = poVar5 + sVar1;
                sVar1 = derOIDDec2(poVar5,sVar4,"1.2.112.0.2.0.34.101.45.3.1");
                if (sVar1 != 0xffffffffffffffff) {
                  poVar5 = poVar5 + sVar1;
                  sVar2 = derTSEQDecStop(poVar5,&dStack_b8);
                  if (sVar2 != 0xffffffffffffffff) {
                    sVar4 = sVar4 - (sVar1 + sVar2);
                    sVar1 = derTBITDec2((octet *)0x0,poVar5 + sVar2,sVar4,3,0x200);
                    if (sVar1 != 0xffffffffffffffff) {
                      poVar5 = poVar5 + sVar2 + sVar1;
                      ci->pubkey_offset = (size_t)(poVar5 + (-0x40 - (long)csr));
                      sVar2 = derTSEQDecStop(poVar5,&local_98);
                      if (sVar2 != 0xffffffffffffffff) {
                        sVar4 = sVar4 - (sVar1 + sVar2);
                        poVar5 = poVar5 + sVar2;
                        sVar1 = derDec2((octet **)0x0,(size_t *)0x0,poVar5,sVar4,0xa0);
                        if (sVar1 != 0xffffffffffffffff) {
                          sVar2 = derTSEQDecStop(poVar5 + sVar1,&local_78);
                          if (sVar2 != 0xffffffffffffffff) {
                            sVar4 = sVar4 - (sVar1 + sVar2);
                            poVar5 = poVar5 + sVar1 + sVar2;
                            ci->body_len = (long)poVar5 - (long)(csr + ci->body_offset);
                            sVar1 = derTSEQDecStart(&dStack_b8,poVar5,sVar4,0x30);
                            if (sVar1 != 0xffffffffffffffff) {
                              sVar4 = sVar4 - sVar1;
                              poVar5 = poVar5 + sVar1;
                              sVar1 = derOIDDec2(poVar5,sVar4,"1.2.112.0.2.0.34.101.45.12");
                              if (sVar1 != 0xffffffffffffffff) {
                                sVar4 = sVar4 - sVar1;
                                poVar5 = poVar5 + sVar1;
                                sVar1 = derDec4(poVar5,sVar4,5,(void *)0x0,0);
                                if (sVar1 != 0xffffffffffffffff) {
                                  poVar5 = poVar5 + sVar1;
                                  sVar2 = derTSEQDecStop(poVar5,&dStack_b8);
                                  if (sVar2 != 0xffffffffffffffff) {
                                    sVar1 = derTBITDec2((octet *)0x0,poVar5 + sVar2,
                                                        sVar4 - (sVar1 + sVar2),3,0x180);
                                    if (sVar1 != 0xffffffffffffffff) {
                                      poVar5 = poVar5 + sVar2 + sVar1;
                                      ci->sig_offset = (size_t)(poVar5 + (-0x30 - (long)csr));
                                      sVar1 = derTSEQDecStop(poVar5,&local_58);
                                      if (sVar1 != 0xffffffffffffffff) {
                                        poVar3 = poVar5 + (sVar1 - (long)csr);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)poVar3;
}

Assistant:

static size_t bpkiCSRDec(bpki_csr_info_t* ci, const octet csr[], size_t count)
{
	der_anchor_t CertReq[1];
	der_anchor_t CertReqInfo[1];
	der_anchor_t SPKI[1];
	der_anchor_t AlgId[1];
	const octet* ptr = csr;
	// pre
	ASSERT(memIsValid(ci, sizeof(bpki_csr_info_t)));
	ASSERT(memIsValid(csr, count));
	// декодировать
	derDecStep(derSEQDecStart(CertReq, ptr, count), ptr, count);
	 ci->body_offset = ptr - csr;
	 derDecStep(derSEQDecStart(CertReqInfo, ptr, count), ptr, count);
	  derDecStep(derSIZEDec2(ptr, count, 0), ptr, count);
	  derDecStep(derDec2(0, 0, ptr, count, 0x30), ptr, count);
	  derDecStep(derSEQDecStart(SPKI, ptr, count), ptr, count);
	   derDecStep(derSEQDecStart(AlgId, ptr, count), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_bign_pubkey), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_bign_curve256v1), ptr, count);
	   derDecStep(derSEQDecStop(ptr, AlgId), ptr, count);
	   derDecStep(derBITDec2(0, ptr, count, 512), ptr, count);
	   ci->pubkey_offset = ptr - csr - 64;
	  derDecStep(derSEQDecStop(ptr, SPKI), ptr, count);
	  derDecStep(derDec2(0, 0, ptr, count, 0xA0), ptr, count);
	 derDecStep(derSEQDecStop(ptr, CertReqInfo), ptr, count);
	 ci->body_len = ptr - csr - ci->body_offset;
	 derDecStep(derSEQDecStart(AlgId, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_bign_with_hbelt), ptr, count);
	  derDecStep(derNULLDec(ptr, count), ptr, count);
     derDecStep(derSEQDecStop(ptr, AlgId), ptr, count);
	 derDecStep(derBITDec2(0, ptr, count, 384), ptr, count);
	 ci->sig_offset = ptr - csr - 48;
	derDecStep(derSEQDecStop(ptr, CertReq), ptr, count);
	// возвратить точную длину DER-кода
	return ptr - csr;
}